

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::LinearQuantizationParams::_InternalSerialize
          (LinearQuantizationParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  RepeatedField<float> *pRVar3;
  byte *pbVar4;
  float *pfVar5;
  LogMessage *pLVar6;
  void *data;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  LinearQuantizationParams *this_local;
  unsigned_long size_1;
  unsigned_long element_size_1;
  unsigned_long size;
  unsigned_long element_size;
  LogFinisher local_125 [20];
  byte local_111;
  LogMessage local_110;
  byte *local_d8;
  uint local_d0;
  int local_cc;
  EpsCopyOutputStream *local_c8;
  byte *local_c0;
  uint local_b4;
  byte *local_b0;
  LogFinisher local_a5 [20];
  byte local_91;
  LogMessage local_90;
  byte *local_58;
  uint local_50;
  int local_4c;
  EpsCopyOutputStream *local_48;
  byte *local_40;
  uint local_34;
  byte *local_30;
  byte *local_28;
  uint local_1c;
  byte *local_18;
  uint local_c;
  
  iVar2 = _internal_scale_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (0 < iVar2) {
    pRVar3 = _internal_scale(this);
    pbVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar2 = google::protobuf::RepeatedField<float>::size(pRVar3);
    local_4c = 1;
    local_50 = 2;
    local_91 = 0;
    local_58 = pbVar4;
    local_48 = stream;
    if (stream->end_ <= pbVar4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      local_91 = 1;
      pLVar6 = google::protobuf::internal::LogMessage::operator<<
                         (&local_90,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(local_a5,pLVar6);
    }
    if ((local_91 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_90);
    }
    local_34 = local_4c << 3 | local_50;
    local_40 = local_58;
    *local_58 = (byte)local_34;
    if (local_34 < 0x80) {
      local_30 = local_58 + 1;
    }
    else {
      *local_58 = *local_58 | 0x80;
      local_34 = local_34 >> 7;
      local_58[1] = (byte)local_34;
      if (local_34 < 0x80) {
        local_30 = local_58 + 2;
      }
      else {
        local_40 = local_58 + 2;
        do {
          local_40[-1] = local_40[-1] | 0x80;
          local_34 = local_34 >> 7;
          *local_40 = (byte)local_34;
          local_40 = local_40 + 1;
          local_30 = local_40;
        } while (0x7f < local_34);
      }
    }
    local_18 = local_30;
    for (local_c = iVar2 << 2; 0x7f < local_c; local_c = local_c >> 7) {
      *local_18 = (byte)local_c | 0x80;
      local_18 = local_18 + 1;
    }
    pbVar4 = local_18 + 1;
    *local_18 = (byte)local_c;
    local_18 = pbVar4;
    pfVar5 = google::protobuf::RepeatedField<float>::data(pRVar3);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                             (stream,pfVar5,iVar2 << 2,pbVar4);
  }
  iVar2 = _internal_bias_size(this);
  if (0 < iVar2) {
    pRVar3 = _internal_bias(this);
    pbVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    iVar2 = google::protobuf::RepeatedField<float>::size(pRVar3);
    local_cc = 2;
    local_d0 = 2;
    local_111 = 0;
    local_d8 = pbVar4;
    local_c8 = stream;
    if (stream->end_ <= pbVar4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      local_111 = 1;
      pLVar6 = google::protobuf::internal::LogMessage::operator<<
                         (&local_110,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(local_125,pLVar6);
    }
    if ((local_111 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    local_b4 = local_cc << 3 | local_d0;
    local_c0 = local_d8;
    *local_d8 = (byte)local_b4;
    if (local_b4 < 0x80) {
      local_b0 = local_d8 + 1;
    }
    else {
      *local_d8 = *local_d8 | 0x80;
      local_b4 = local_b4 >> 7;
      local_d8[1] = (byte)local_b4;
      if (local_b4 < 0x80) {
        local_b0 = local_d8 + 2;
      }
      else {
        local_c0 = local_d8 + 2;
        do {
          local_c0[-1] = local_c0[-1] | 0x80;
          local_b4 = local_b4 >> 7;
          *local_c0 = (byte)local_b4;
          local_c0 = local_c0 + 1;
          local_b0 = local_c0;
        } while (0x7f < local_b4);
      }
    }
    local_28 = local_b0;
    for (local_1c = iVar2 << 2; 0x7f < local_1c; local_1c = local_1c >> 7) {
      *local_28 = (byte)local_1c | 0x80;
      local_28 = local_28 + 1;
    }
    pbVar4 = local_28 + 1;
    *local_28 = (byte)local_1c;
    local_28 = pbVar4;
    pfVar5 = google::protobuf::RepeatedField<float>::data(pRVar3);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<4>
                             (stream,pfVar5,iVar2 << 2,pbVar4);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar2 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar2,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* LinearQuantizationParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.LinearQuantizationParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float scale = 1;
  if (this->_internal_scale_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_scale(), target);
  }

  // repeated float bias = 2;
  if (this->_internal_bias_size() > 0) {
    target = stream->WriteFixedPacked(2, _internal_bias(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.LinearQuantizationParams)
  return target;
}